

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O3

BinaryPacketProtocol *
ssh_verstring_new(Conf *conf,LogContext *logctx,_Bool bare_connection_mode,char *protoversion,
                 ssh_version_receiver *rcv,_Bool server_mode,char *impl_name)

{
  int iVar1;
  void *__s;
  Conf *pCVar2;
  strbuf *psVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  undefined8 uVar5;
  undefined3 in_register_00000089;
  bool bVar6;
  
  __s = safemalloc(1,400,0);
  memset(__s,0,400);
  pcVar4 = "SSH-";
  bVar6 = (int)CONCAT71(in_register_00000011,bare_connection_mode) != 0;
  if (bVar6) {
    pcVar4 = "SSHCONNECTION@putty.projects.tartarus.org-";
  }
  uVar5 = 4;
  if (bVar6) {
    uVar5 = 0x2a;
  }
  *(char **)((long)__s + 0x10) = pcVar4;
  *(undefined8 *)((long)__s + 0x18) = uVar5;
  pCVar2 = conf_copy(conf);
  *(Conf **)((long)__s + 8) = pCVar2;
  *(LogContext **)((long)__s + 0x148) = logctx;
  pcVar4 = dupstr(protoversion);
  *(char **)((long)__s + 0x20) = pcVar4;
  *(ssh_version_receiver **)((long)__s + 0x28) = rcv;
  pcVar4 = dupstr(impl_name);
  *(char **)((long)__s + 0x80) = pcVar4;
  psVar3 = strbuf_new();
  *(strbuf **)((long)__s + 0x88) = psVar3;
  bVar6 = true;
  if (CONCAT31(in_register_00000089,server_mode) == 0) {
    iVar1 = ssh_versioncmp(protoversion,"2.0");
    bVar6 = -1 < iVar1;
  }
  *(bool *)((long)__s + 0x30) = bVar6;
  iVar1 = conf_get_int(*(Conf **)((long)__s + 8),0xbe);
  if (iVar1 == 0) {
    *(undefined1 *)((long)__s + 0x30) = 0;
  }
  *(BinaryPacketProtocolVtable **)((long)__s + 0xb0) = &ssh_verstring_vtable;
  ssh_bpp_common_setup((BinaryPacketProtocol *)((long)__s + 0xb0));
  return (BinaryPacketProtocol *)((long)__s + 0xb0);
}

Assistant:

BinaryPacketProtocol *ssh_verstring_new(
    Conf *conf, LogContext *logctx, bool bare_connection_mode,
    const char *protoversion, struct ssh_version_receiver *rcv,
    bool server_mode, const char *impl_name)
{
    struct ssh_verstring_state *s = snew(struct ssh_verstring_state);

    memset(s, 0, sizeof(struct ssh_verstring_state));

    if (!bare_connection_mode) {
        s->prefix_wanted = PTRLEN_LITERAL("SSH-");
    } else {
        /*
         * Ordinary SSH begins with the banner "SSH-x.y-...". Here,
         * we're going to be speaking just the ssh-connection
         * subprotocol, extracted and given a trivial binary packet
         * protocol, so we need a new banner.
         *
         * The new banner is like the ordinary SSH banner, but
         * replaces the prefix 'SSH-' at the start with a new name. In
         * proper SSH style (though of course this part of the proper
         * SSH protocol _isn't_ subject to this kind of
         * DNS-domain-based extension), we define the new name in our
         * extension space.
         */
        s->prefix_wanted = PTRLEN_LITERAL(
            "SSHCONNECTION@putty.projects.tartarus.org-");
    }
    assert(s->prefix_wanted.len <= PREFIX_MAXLEN);

    s->conf = conf_copy(conf);
    s->bpp.logctx = logctx;
    s->our_protoversion = dupstr(protoversion);
    s->receiver = rcv;
    s->impl_name = dupstr(impl_name);
    s->vstring = strbuf_new();

    /*
     * We send our version string early if we can. But if it includes
     * SSH-1, we can't, because we have to take the other end into
     * account too (see below).
     *
     * In server mode, we do send early.
     */
    s->send_early = server_mode || !ssh_version_includes_v1(protoversion);

    /*
     * Override: we don't send our version string early if the server
     * has a bug that will make it discard it. See for example
     * https://bugs.debian.org/cgi-bin/bugreport.cgi?bug=991958
     */
    if (conf_get_int(s->conf, CONF_sshbug_dropstart) == FORCE_ON)
        s->send_early = false;

    s->bpp.vt = &ssh_verstring_vtable;
    ssh_bpp_common_setup(&s->bpp);
    return &s->bpp;
}